

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void RtMidi::getCompiledApi(vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *apis)

{
  pointer pAVar1;
  pointer pAVar2;
  allocator_type local_29;
  pointer local_28;
  pointer pAStack_20;
  pointer local_18;
  
  std::vector<RtMidi::Api,std::allocator<RtMidi::Api>>::vector<RtMidi::Api_const*,void>
            ((vector<RtMidi::Api,std::allocator<RtMidi::Api>> *)&local_28,rtmidi_compiled_apis,
             rtmidi_compiled_apis + 1,&local_29);
  pAVar1 = (apis->super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pAVar2 = (apis->super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (apis->super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>)._M_impl.
  super__Vector_impl_data._M_start = local_28;
  (apis->super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>)._M_impl.
  super__Vector_impl_data._M_finish = pAStack_20;
  (apis->super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_18;
  local_28 = (pointer)0x0;
  pAStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  if (pAVar1 != (pointer)0x0) {
    operator_delete(pAVar1,(long)pAVar2 - (long)pAVar1);
    if (local_28 != (pointer)0x0) {
      operator_delete(local_28,(long)local_18 - (long)local_28);
    }
  }
  return;
}

Assistant:

void RtMidi :: getCompiledApi( std::vector<RtMidi::Api> &apis ) throw()
{
  apis = std::vector<RtMidi::Api>(rtmidi_compiled_apis,
                                  rtmidi_compiled_apis + rtmidi_num_compiled_apis);
}